

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_positional_scan.cpp
# Opt level: O3

void __thiscall
duckdb::PositionalTableScanner::PositionalTableScanner
          (PositionalTableScanner *this,ExecutionContext *context,PhysicalOperator *table_p,
          GlobalSourceState *gstate_p)

{
  _Head_base<0UL,_duckdb::LocalSourceState_*,_false> _Var1;
  _Head_base<0UL,_duckdb::LocalSourceState_*,_false> _Var2;
  LocalSourceState *in_RAX;
  Allocator *allocator;
  _Head_base<0UL,_duckdb::LocalSourceState_*,_false> local_28;
  
  this->table = table_p;
  this->global_state = gstate_p;
  (this->local_state).
  super_unique_ptr<duckdb::LocalSourceState,_std::default_delete<duckdb::LocalSourceState>_>._M_t.
  super___uniq_ptr_impl<duckdb::LocalSourceState,_std::default_delete<duckdb::LocalSourceState>_>.
  _M_t.
  super__Tuple_impl<0UL,_duckdb::LocalSourceState_*,_std::default_delete<duckdb::LocalSourceState>_>
  .super__Head_base<0UL,_duckdb::LocalSourceState_*,_false>._M_head_impl = (LocalSourceState *)0x0;
  local_28._M_head_impl = in_RAX;
  DataChunk::DataChunk(&this->source);
  this->source_offset = 0;
  this->exhausted = false;
  (*this->table->_vptr_PhysicalOperator[0xf])(&local_28,this->table,context,gstate_p);
  _Var2._M_head_impl = local_28._M_head_impl;
  local_28._M_head_impl = (LocalSourceState *)0x0;
  _Var1._M_head_impl =
       (this->local_state).
       super_unique_ptr<duckdb::LocalSourceState,_std::default_delete<duckdb::LocalSourceState>_>.
       _M_t.
       super___uniq_ptr_impl<duckdb::LocalSourceState,_std::default_delete<duckdb::LocalSourceState>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::LocalSourceState_*,_std::default_delete<duckdb::LocalSourceState>_>
       .super__Head_base<0UL,_duckdb::LocalSourceState_*,_false>._M_head_impl;
  (this->local_state).
  super_unique_ptr<duckdb::LocalSourceState,_std::default_delete<duckdb::LocalSourceState>_>._M_t.
  super___uniq_ptr_impl<duckdb::LocalSourceState,_std::default_delete<duckdb::LocalSourceState>_>.
  _M_t.
  super__Tuple_impl<0UL,_duckdb::LocalSourceState_*,_std::default_delete<duckdb::LocalSourceState>_>
  .super__Head_base<0UL,_duckdb::LocalSourceState_*,_false>._M_head_impl = _Var2._M_head_impl;
  if (_Var1._M_head_impl != (LocalSourceState *)0x0) {
    (*(_Var1._M_head_impl)->_vptr_LocalSourceState[1])();
    if (local_28._M_head_impl != (LocalSourceState *)0x0) {
      (*(local_28._M_head_impl)->_vptr_LocalSourceState[1])();
    }
  }
  allocator = Allocator::Get(context->client);
  DataChunk::Initialize(&this->source,allocator,&this->table->types,0x800);
  return;
}

Assistant:

PositionalTableScanner(ExecutionContext &context, PhysicalOperator &table_p, GlobalSourceState &gstate_p)
	    : table(table_p), global_state(gstate_p), source_offset(0), exhausted(false) {
		local_state = table.GetLocalSourceState(context, gstate_p);
		source.Initialize(Allocator::Get(context.client), table.types);
	}